

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O3

EncodingResult<kj::Array<wchar_t>_> *
kj::encodeWideString
          (EncodingResult<kj::Array<wchar_t>_> *__return_storage_ptr__,ArrayPtr<const_char> text,
          bool nulTerminate)

{
  undefined7 in_register_00000009;
  bool in_R8B;
  ArrayPtr<const_char> text_00;
  EncodingResult<kj::Array<char32_t>_> local_30;
  
  text_00.size_._1_7_ = in_register_00000009;
  text_00.size_._0_1_ = nulTerminate;
  text_00.ptr = (char *)text.size_;
  encodeUtf32(&local_30,(kj *)text.ptr,text_00,in_R8B);
  (__return_storage_ptr__->super_Array<wchar_t>).ptr = local_30.super_Array<char32_t>.ptr;
  (__return_storage_ptr__->super_Array<wchar_t>).size_ = local_30.super_Array<char32_t>.size_;
  (__return_storage_ptr__->super_Array<wchar_t>).disposer = local_30.super_Array<char32_t>.disposer;
  __return_storage_ptr__->hadErrors = local_30.hadErrors;
  return __return_storage_ptr__;
}

Assistant:

EncodingResult<Array<wchar_t>> encodeWideString(ArrayPtr<const char> text, bool nulTerminate) {
  return coerceTo<wchar_t>(WideConverter<sizeof(wchar_t)>::encode(text, nulTerminate));
}